

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O3

void __thiscall
Statsd::StatsdClient::send<double>
          (StatsdClient *this,string *key,double value,char *type,float frequency,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  string *message;
  pointer pbVar1;
  UDPSender *this_00;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  pointer pbVar6;
  uint uVar7;
  long *in_FS_OFFSET;
  float fVar8;
  float fVar9;
  string __str;
  stringstream valueStream;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  double local_1c0;
  stringstream local_1b8 [16];
  long local_1a8;
  long local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  if (((this->m_sender)._M_t.
       super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>._M_t.
       super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
       super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl)->m_socket != -1) {
    fVar8 = 1.0;
    if (frequency <= 1.0) {
      fVar8 = frequency;
    }
    if ((0.0 <= fVar8) && (1.0 < frequency || 0.0001 <= ABS(frequency))) {
      fVar9 = 0.0;
      if (0.0 <= fVar8) {
        fVar9 = fVar8;
      }
      local_1c0 = value;
      if ((0.0001 <= ABS(fVar9 + -1.0)) &&
         (fVar8 = std::
                  generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            (&this->m_randomEngine), fVar9 < fVar8)) {
        return;
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
      *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)this->m_gaugePrecision;
      std::ostream::_M_insert<double>(local_1c0);
      if ((char)in_FS_OFFSET[-1] == '\0') {
        send<double>();
      }
      message = (string *)(*in_FS_OFFSET + -0x28);
      in_FS_OFFSET[-4] = 0;
      *(undefined1 *)in_FS_OFFSET[-5] = 0;
      std::__cxx11::string::reserve((ulong)message);
      std::__cxx11::string::_M_append((char *)message,(ulong)(this->m_prefix)._M_dataplus._M_p);
      cVar5 = (char)message;
      if (key->_M_string_length != 0 && (this->m_prefix)._M_string_length != 0) {
        std::__cxx11::string::push_back(cVar5);
      }
      std::__cxx11::string::_M_append((char *)message,(ulong)(key->_M_dataplus)._M_p);
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)message,(ulong)local_1e0[0]);
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0]);
      }
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::append((char *)message);
      if (fVar9 < 1.0) {
        std::__cxx11::string::append((char *)message);
        uVar7 = (uint)(fVar9 * 100.0);
        __val = -uVar7;
        if (0 < (int)uVar7) {
          __val = uVar7;
        }
        __len = 1;
        if (9 < __val) {
          uVar4 = (ulong)__val;
          uVar2 = 4;
          do {
            __len = uVar2;
            uVar3 = (uint)uVar4;
            if (uVar3 < 100) {
              __len = __len - 2;
              goto LAB_001085a8;
            }
            if (uVar3 < 1000) {
              __len = __len - 1;
              goto LAB_001085a8;
            }
            if (uVar3 < 10000) goto LAB_001085a8;
            uVar4 = uVar4 / 10000;
            uVar2 = __len + 4;
          } while (99999 < uVar3);
          __len = __len + 1;
        }
LAB_001085a8:
        local_1e0[0] = local_1d0;
        std::__cxx11::string::_M_construct
                  ((ulong)local_1e0,(char)__len - (char)((int)uVar7 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_1e0[0] + (uVar7 >> 0x1f),__len,__val);
        std::__cxx11::string::_M_append((char *)message,(ulong)local_1e0[0]);
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0]);
        }
      }
      if ((tags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (tags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::append((char *)message);
        pbVar1 = (tags->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (tags->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          std::__cxx11::string::_M_append((char *)message,(ulong)(pbVar6->_M_dataplus)._M_p);
          std::__cxx11::string::push_back(cVar5);
        }
        std::__cxx11::string::pop_back();
      }
      this_00 = (this->m_sender)._M_t.
                super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>.
                _M_t.
                super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>
                .super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl;
      (this_00->m_errorMessage)._M_string_length = 0;
      *(this_00->m_errorMessage)._M_dataplus._M_p = '\0';
      if (this_00->m_batchsize == 0) {
        UDPSender::sendToDaemon(this_00,message);
      }
      else {
        UDPSender::queueMessage(this_00,message);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return;
}

Assistant:

inline void StatsdClient::send(const std::string& key,
                               const T value,
                               const char* type,
                               float frequency,
                               const std::vector<std::string>& tags) const noexcept {
    // Bail if we can't send anything anyway
    if (!m_sender->initialized()) {
        return;
    }

    // A valid frequency is: 0 <= f <= 1
    // At 0 you never emit the stat, at 1 you always emit the stat and with anything else you roll the dice
    frequency = std::max(std::min(frequency, 1.f), 0.f);
    constexpr float epsilon{0.0001f};
    const bool isFrequencyOne = std::fabs(frequency - 1.0f) < epsilon;
    const bool isFrequencyZero = std::fabs(frequency) < epsilon;
    if (isFrequencyZero ||
        (!isFrequencyOne && (frequency < std::uniform_real_distribution<float>(0.f, 1.f)(m_randomEngine)))) {
        return;
    }

    // Format the stat message
    std::stringstream valueStream;
    valueStream << std::fixed << std::setprecision(m_gaugePrecision) << value;

    // the thread keeps this buffer around and reuses it, clear should be O(1)
    // and reserve should only have to do so the first time, after that, it's a no-op
    static thread_local std::string buffer;
    buffer.clear();
    buffer.reserve(256);

    buffer.append(m_prefix);
    if (!m_prefix.empty() && !key.empty()) {
        buffer.push_back('.');
    }

    buffer.append(key);
    buffer.push_back(':');
    buffer.append(valueStream.str());
    buffer.push_back('|');
    buffer.append(type);

    if (frequency < 1.f) {
        buffer.append("|@0.");
        buffer.append(std::to_string(static_cast<int>(frequency * 100)));
    }

    if (!tags.empty()) {
        buffer.append("|#");
        for (const auto& tag : tags) {
            buffer.append(tag);
            buffer.push_back(',');
        }
        buffer.pop_back();
    }

    // Send the message via the UDP sender
    m_sender->send(buffer);
}